

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::handle
          (CombinedImageSamplerHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  ID id;
  VariableID combined_module_id;
  SPIRFunction *caller;
  CombinedImageSampler *pCVar1;
  size_t sVar2;
  uint32_t uVar3;
  bool bVar4;
  undefined2 uVar5;
  Dim DVar6;
  bool bVar7;
  undefined1 uVar8;
  ImageFormat IVar9;
  AccessQualifier AVar10;
  TypeID TVar11;
  TypeID TVar12;
  bool bVar13;
  ID id_00;
  ID id_01;
  uint32_t uVar14;
  uint32_t uVar15;
  Op id_02;
  ulong uVar16;
  SPIRVariable *pSVar17;
  SPIRType *pSVar18;
  CompilerError *this_00;
  _Elt_pointer ppSVar19;
  SPIRType *pSVar20;
  uint32_t *puVar21;
  CombinedImageSampler *pCVar22;
  VariableID image_id;
  VariableID sampler_id;
  long lVar23;
  long lVar24;
  Compiler *pCVar25;
  size_t sVar26;
  uint32_t result_type;
  Op local_54;
  ID local_50;
  bool local_4c [4];
  SmallVector<bool,_8UL> *local_48;
  SmallVector<unsigned_int,_8UL> *local_40;
  int local_34;
  
  uVar16 = (ulong)(opcode - OpAccessChain);
  if (0x2a < opcode - OpAccessChain) {
LAB_00387b95:
    if (opcode != OpLoad) {
      return true;
    }
    if (length < 3) {
      return false;
    }
    local_54 = *args;
    pSVar18 = Variant::get<spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                         local_54);
    if ((pSVar18->basetype != Sampler) &&
       ((pSVar18->image).sampled != 1 || pSVar18->basetype != Image)) {
      return true;
    }
LAB_00387a69:
    uVar14 = args[1];
    uVar15 = args[2];
    local_4c[0] = true;
    set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              (this->compiler,uVar14,(char (*) [1])0x3dee59,&local_54,local_4c);
    register_read(this->compiler,uVar14,uVar15,true);
    return true;
  }
  if ((0x6c040000000U >> (uVar16 & 0x3f) & 1) == 0) {
    if ((7UL >> (uVar16 & 0x3f) & 1) != 0) {
      if (length < 3) {
        return false;
      }
      local_54 = *args;
      pSVar18 = Variant::get<spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           local_54);
      if (pSVar18->basetype == Sampler) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Attempting to use arrays or structs of separate samplers. This is not possible to statically remap to plain GLSL."
                  );
        goto LAB_003880a2;
      }
      if (pSVar18->basetype != Image) {
        return true;
      }
      if ((pSVar18->image).sampled != 1) {
        return true;
      }
      goto LAB_00387a69;
    }
    if (uVar16 != 0x15) goto LAB_00387b95;
    bVar13 = false;
  }
  else {
    pSVar17 = maybe_get_backing_variable(this->compiler,args[2]);
    if (pSVar17 == (SPIRVariable *)0x0) {
      return true;
    }
    pSVar18 = Variant::get<spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar17->super_IVariant).field_0xc);
    if (pSVar18->basetype != Image) {
      return true;
    }
    if ((pSVar18->image).sampled != 1) {
      return true;
    }
    if ((pSVar18->image).dim == Buffer) {
      return true;
    }
    bVar13 = true;
    if (this->compiler->dummy_sampler_id == 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "texelFetch without sampler was found, but no dummy sampler has been created with build_dummy_sampler_for_combined_images()."
                );
LAB_003880a2:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ppSVar19 = (this->functions).c.
             super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar19 !=
      (this->functions).c.
      super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppSVar19 ==
        (this->functions).c.
        super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar19 = (this->functions).c.
                 super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    caller = ppSVar19[-1];
    if (caller->do_combined_parameters == true) {
      image_id.id = args[2];
      pSVar17 = maybe_get_backing_variable(this->compiler,image_id.id);
      if (pSVar17 != (SPIRVariable *)0x0) {
        image_id.id = (pSVar17->super_IVariant).self.id;
      }
      puVar21 = args + 3;
      if (bVar13) {
        puVar21 = &this->compiler->dummy_sampler_id;
      }
      sampler_id.id = *puVar21;
      pSVar17 = maybe_get_backing_variable(this->compiler,sampler_id.id);
      if (pSVar17 != (SPIRVariable *)0x0) {
        sampler_id.id = (pSVar17->super_IVariant).self.id;
      }
      combined_module_id.id = args[1];
      pSVar18 = Variant::get<spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           *args);
      register_combined_image_sampler
                (this,caller,combined_module_id,image_id,sampler_id,(pSVar18->image).depth);
    }
  }
  id_00.id = remap_parameter(this,args[2]);
  if (bVar13) {
    pCVar25 = this->compiler;
    id_01.id = pCVar25->dummy_sampler_id;
  }
  else {
    id_01.id = remap_parameter(this,args[3]);
    pCVar25 = this->compiler;
  }
  pCVar1 = (pCVar25->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
           ptr;
  sVar2 = (pCVar25->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  lVar23 = (long)sVar2 >> 2;
  pCVar22 = pCVar1;
  sVar26 = sVar2;
  if (0 < lVar23) {
    lVar24 = lVar23 + 1;
    pCVar22 = pCVar1 + 2;
    do {
      if ((pCVar22[-2].image_id.id == id_00.id) && (pCVar22[-2].sampler_id.id == id_01.id)) {
        pCVar22 = pCVar22 + -2;
        goto LAB_00387d04;
      }
      if ((pCVar22[-1].image_id.id == id_00.id) && (pCVar22[-1].sampler_id.id == id_01.id)) {
        pCVar22 = pCVar22 + -1;
        goto LAB_00387d04;
      }
      if (((pCVar22->image_id).id == id_00.id) && ((pCVar22->sampler_id).id == id_01.id))
      goto LAB_00387d04;
      if ((pCVar22[1].image_id.id == id_00.id) && (pCVar22[1].sampler_id.id == id_01.id)) {
        pCVar22 = pCVar22 + 1;
        goto LAB_00387d04;
      }
      lVar24 = lVar24 + -1;
      pCVar22 = pCVar22 + 4;
    } while (1 < lVar24);
    sVar26 = ((long)(sVar2 * 0xc + lVar23 * -0x30) >> 2) * -0x5555555555555555;
    pCVar22 = pCVar1 + lVar23 * 4;
  }
  if (sVar26 == 1) {
LAB_00387c9b:
    if (((pCVar22->image_id).id != id_00.id) || ((pCVar22->sampler_id).id != id_01.id))
    goto LAB_00387d10;
  }
  else if (sVar26 == 2) {
LAB_00387c8c:
    if (((pCVar22->image_id).id != id_00.id) || ((pCVar22->sampler_id).id != id_01.id)) {
      pCVar22 = pCVar22 + 1;
      goto LAB_00387c9b;
    }
  }
  else {
    if (sVar26 != 3) goto LAB_00387d10;
    if (((pCVar22->image_id).id != id_00.id) || ((pCVar22->sampler_id).id != id_01.id)) {
      pCVar22 = pCVar22 + 1;
      goto LAB_00387c8c;
    }
  }
LAB_00387d04:
  if (pCVar22 != pCVar1 + sVar2) {
    return true;
  }
LAB_00387d10:
  if (bVar13) {
    uVar14 = ParsedIR::increase_bound_by(&pCVar25->ir,1);
    local_54 = OpTypeSampledImage;
    pSVar18 = set<spirv_cross::SPIRType,spv::Op>(this->compiler,uVar14,&local_54);
    pCVar25 = this->compiler;
    uVar15 = expression_type_id(pCVar25,args[2]);
    pSVar20 = Variant::get<spirv_cross::SPIRType>
                        ((pCVar25->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar15);
    (pSVar18->super_IVariant).self.id = (pSVar20->super_IVariant).self.id;
    pSVar18->columns = pSVar20->columns;
    uVar15 = pSVar20->width;
    uVar3 = pSVar20->vecsize;
    *(undefined8 *)&(pSVar18->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar20->super_IVariant).field_0xc;
    pSVar18->width = uVar15;
    pSVar18->vecsize = uVar3;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar18->array,&pSVar20->array);
    SmallVector<bool,_8UL>::operator=(&pSVar18->array_size_literal,&pSVar20->array_size_literal);
    bVar13 = pSVar20->pointer;
    bVar4 = pSVar20->forward_pointer;
    uVar5 = *(undefined2 *)&pSVar20->field_0x7e;
    pSVar18->pointer_depth = pSVar20->pointer_depth;
    pSVar18->pointer = bVar13;
    pSVar18->forward_pointer = bVar4;
    *(undefined2 *)&pSVar18->field_0x7e = uVar5;
    pSVar18->storage = pSVar20->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar18->member_types,&pSVar20->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar18->member_type_index_redirection,&pSVar20->member_type_index_redirection);
    DVar6 = (pSVar20->image).dim;
    bVar13 = (pSVar20->image).depth;
    bVar4 = (pSVar20->image).arrayed;
    bVar7 = (pSVar20->image).ms;
    uVar8 = (pSVar20->image).field_0xb;
    uVar15 = (pSVar20->image).sampled;
    IVar9 = (pSVar20->image).format;
    AVar10 = (pSVar20->image).access;
    TVar11.id = (pSVar20->type_alias).id;
    TVar12.id = (pSVar20->parent_type).id;
    (pSVar18->image).type = (TypeID)(pSVar20->image).type.id;
    (pSVar18->image).dim = DVar6;
    (pSVar18->image).depth = bVar13;
    (pSVar18->image).arrayed = bVar4;
    (pSVar18->image).ms = bVar7;
    (pSVar18->image).field_0xb = uVar8;
    (pSVar18->image).sampled = uVar15;
    (pSVar18->image).format = IVar9;
    (pSVar18->image).access = AVar10;
    pSVar18->type_alias = (TypeID)TVar11.id;
    pSVar18->parent_type = (TypeID)TVar12.id;
    if (pSVar20 != pSVar18) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar18->member_name_cache,&(pSVar20->member_name_cache)._M_h);
    }
    (pSVar18->super_IVariant).self.id = uVar14;
    pSVar18->basetype = SampledImage;
    (pSVar18->image).depth = false;
    local_50.id = 0;
  }
  else {
    uVar14 = *args;
    local_50.id = args[1];
  }
  id_02 = ParsedIR::increase_bound_by(&this->compiler->ir,2);
  id.id = id_02 + OpUndef;
  local_4c[0] = true;
  local_4c[1] = false;
  local_4c[2] = false;
  local_4c[3] = false;
  local_54 = id_02;
  pSVar18 = set<spirv_cross::SPIRType,spv::Op>(this->compiler,id_02,(Op *)local_4c);
  pSVar20 = Variant::get<spirv_cross::SPIRType>
                      ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar14)
  ;
  (pSVar18->super_IVariant).self.id = (pSVar20->super_IVariant).self.id;
  pSVar18->columns = pSVar20->columns;
  uVar14 = pSVar20->width;
  uVar15 = pSVar20->vecsize;
  *(undefined8 *)&(pSVar18->super_IVariant).field_0xc =
       *(undefined8 *)&(pSVar20->super_IVariant).field_0xc;
  pSVar18->width = uVar14;
  pSVar18->vecsize = uVar15;
  local_40 = &pSVar18->array;
  SmallVector<unsigned_int,_8UL>::operator=(local_40,&pSVar20->array);
  local_48 = &pSVar18->array_size_literal;
  SmallVector<bool,_8UL>::operator=(local_48,&pSVar20->array_size_literal);
  bVar13 = pSVar20->pointer;
  bVar4 = pSVar20->forward_pointer;
  uVar5 = *(undefined2 *)&pSVar20->field_0x7e;
  pSVar18->pointer_depth = pSVar20->pointer_depth;
  pSVar18->pointer = bVar13;
  pSVar18->forward_pointer = bVar4;
  *(undefined2 *)&pSVar18->field_0x7e = uVar5;
  pSVar18->storage = pSVar20->storage;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
            (&pSVar18->member_types,&pSVar20->member_types);
  SmallVector<unsigned_int,_8UL>::operator=
            (&pSVar18->member_type_index_redirection,&pSVar20->member_type_index_redirection);
  DVar6 = (pSVar20->image).dim;
  bVar13 = (pSVar20->image).depth;
  bVar4 = (pSVar20->image).arrayed;
  bVar7 = (pSVar20->image).ms;
  uVar8 = (pSVar20->image).field_0xb;
  uVar14 = (pSVar20->image).sampled;
  IVar9 = (pSVar20->image).format;
  AVar10 = (pSVar20->image).access;
  TVar11.id = (pSVar20->type_alias).id;
  TVar12.id = (pSVar20->parent_type).id;
  (pSVar18->image).type = (TypeID)(pSVar20->image).type.id;
  (pSVar18->image).dim = DVar6;
  (pSVar18->image).depth = bVar13;
  (pSVar18->image).arrayed = bVar4;
  (pSVar18->image).ms = bVar7;
  (pSVar18->image).field_0xb = uVar8;
  (pSVar18->image).sampled = uVar14;
  (pSVar18->image).format = IVar9;
  (pSVar18->image).access = AVar10;
  pSVar18->type_alias = (TypeID)TVar11.id;
  pSVar18->parent_type = (TypeID)TVar12.id;
  if (pSVar20 != pSVar18) {
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&pSVar18->member_name_cache,&(pSVar20->member_name_cache)._M_h);
  }
  pSVar18->pointer = true;
  pSVar18->storage = StorageClassUniformConstant;
  (pSVar18->parent_type).id = id_02;
  local_4c[0] = false;
  local_4c[1] = false;
  local_4c[2] = false;
  local_4c[3] = false;
  local_34 = 0;
  set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
            (this->compiler,id.id,&local_54,(StorageClass *)local_4c,&local_34);
  if ((((id_01.id != 0) &&
       (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,id_01,DecorationRelaxedPrecision),
       bVar13)) ||
      ((id_00.id != 0 &&
       (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,id_00,DecorationRelaxedPrecision),
       bVar13)))) ||
     ((local_50.id != 0 &&
      (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,local_50,DecorationRelaxedPrecision),
      bVar13)))) {
    ParsedIR::set_decoration(&this->compiler->ir,id,DecorationRelaxedPrecision,0);
  }
  pSVar17 = maybe_get_backing_variable(this->compiler,id_00.id);
  if (pSVar17 != (SPIRVariable *)0x0) {
    pSVar18 = Variant::get<spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar17->super_IVariant).field_0xc);
    SmallVector<unsigned_int,_8UL>::operator=(local_40,&pSVar18->array);
    SmallVector<bool,_8UL>::operator=(local_48,&pSVar18->array_size_literal);
  }
  pCVar25 = this->compiler;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL>::reserve
            (&pCVar25->combined_image_samplers,
             (pCVar25->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
             buffer_size + 1);
  pCVar22 = (pCVar25->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
            ptr;
  sVar2 = (pCVar25->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  pCVar22[sVar2].combined_id.id = id.id;
  pCVar22[sVar2].image_id.id = id_00.id;
  pCVar22[sVar2].sampler_id.id = id_01.id;
  (pCVar25->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size
       = sVar2 + 1;
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// We need to figure out where samplers and images are loaded from, so do only the bare bones compilation we need.
	bool is_fetch = false;

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;

		// If not separate image or sampler, don't bother.
		if (!separate_image && !separate_sampler)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		return true;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Technically, it is possible to have arrays of textures and arrays of samplers and combine them, but this becomes essentially
		// impossible to implement, since we don't know which concrete sampler we are accessing.
		// One potential way is to create a combinatorial explosion where N textures and M samplers are combined into N * M sampler2Ds,
		// but this seems ridiculously complicated for a problem which is easy to work around.
		// Checking access chains like this assumes we don't have samplers or textures inside uniform structs, but this makes no sense.

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;
		if (separate_sampler)
			SPIRV_CROSS_THROW(
			    "Attempting to use arrays or structs of separate samplers. This is not possible to statically "
			    "remap to plain GLSL.");

		if (separate_image)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
		}
		return true;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching from a plain OpTypeImage or querying LOD, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (!var)
			return true;

		auto &type = compiler.get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (compiler.dummy_sampler_id == 0)
				SPIRV_CROSS_THROW("texelFetch without sampler was found, but no dummy sampler has been created with "
				                  "build_dummy_sampler_for_combined_images().");

			// Do it outside.
			is_fetch = true;
			break;
		}

		return true;
	}

	case OpSampledImage:
		// Do it outside.
		break;

	default:
		return true;
	}

	// Registers sampler2D calls used in case they are parameters so
	// that their callees know which combined image samplers to propagate down the call stack.
	if (!functions.empty())
	{
		auto &callee = *functions.top();
		if (callee.do_combined_parameters)
		{
			uint32_t image_id = args[2];

			auto *image = compiler.maybe_get_backing_variable(image_id);
			if (image)
				image_id = image->self;

			uint32_t sampler_id = is_fetch ? compiler.dummy_sampler_id : args[3];
			auto *sampler = compiler.maybe_get_backing_variable(sampler_id);
			if (sampler)
				sampler_id = sampler->self;

			uint32_t combined_id = args[1];

			auto &combined_type = compiler.get<SPIRType>(args[0]);
			register_combined_image_sampler(callee, combined_id, image_id, sampler_id, combined_type.image.depth);
		}
	}

	// For function calls, we need to remap IDs which are function parameters into global variables.
	// This information is statically known from the current place in the call stack.
	// Function parameters are not necessarily pointers, so if we don't have a backing variable, remapping will know
	// which backing variable the image/sample came from.
	VariableID image_id = remap_parameter(args[2]);
	VariableID sampler_id = is_fetch ? compiler.dummy_sampler_id : remap_parameter(args[3]);

	auto itr = find_if(begin(compiler.combined_image_samplers), end(compiler.combined_image_samplers),
	                   [image_id, sampler_id](const CombinedImageSampler &combined) {
		                   return combined.image_id == image_id && combined.sampler_id == sampler_id;
	                   });

	if (itr == end(compiler.combined_image_samplers))
	{
		uint32_t sampled_type;
		uint32_t combined_module_id;
		if (is_fetch)
		{
			// Have to invent the sampled image type.
			sampled_type = compiler.ir.increase_bound_by(1);
			auto &type = compiler.set<SPIRType>(sampled_type, OpTypeSampledImage);
			type = compiler.expression_type(args[2]);
			type.self = sampled_type;
			type.basetype = SPIRType::SampledImage;
			type.image.depth = false;
			combined_module_id = 0;
		}
		else
		{
			sampled_type = args[0];
			combined_module_id = args[1];
		}

		auto id = compiler.ir.increase_bound_by(2);
		auto type_id = id + 0;
		auto combined_id = id + 1;

		// Make a new type, pointer to OpTypeSampledImage, so we can make a variable of this type.
		// We will probably have this type lying around, but it doesn't hurt to make duplicates for internal purposes.
		auto &type = compiler.set<SPIRType>(type_id, OpTypePointer);
		auto &base = compiler.get<SPIRType>(sampled_type);
		type = base;
		type.pointer = true;
		type.storage = StorageClassUniformConstant;
		type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, type_id, StorageClassUniformConstant, 0);

		// Inherit RelaxedPrecision (and potentially other useful flags if deemed relevant).
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    (sampler_id && compiler.has_decoration(sampler_id, DecorationRelaxedPrecision)) ||
		    (image_id && compiler.has_decoration(image_id, DecorationRelaxedPrecision)) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		// Propagate the array type for the original image as well.
		auto *var = compiler.maybe_get_backing_variable(image_id);
		if (var)
		{
			auto &parent_type = compiler.get<SPIRType>(var->basetype);
			type.array = parent_type.array;
			type.array_size_literal = parent_type.array_size_literal;
		}

		compiler.combined_image_samplers.push_back({ combined_id, image_id, sampler_id });
	}

	return true;
}